

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_scientific.h
# Opt level: O2

void __thiscall
icu_63::numparse::impl::ScientificMatcher::ScientificMatcher(ScientificMatcher *this)

{
  (this->super_NumberParseMatcher)._vptr_NumberParseMatcher =
       (_func_int **)&PTR__ScientificMatcher_0039e348;
  (this->fExponentSeparatorString).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003a7268;
  (this->fExponentSeparatorString).fUnion.fStackFields.fLengthAndFlags = 2;
  (this->fExponentMatcher).super_NumberParseMatcher._vptr_NumberParseMatcher =
       (_func_int **)&PTR__DecimalMatcher_0039f580;
  (this->fExponentMatcher).groupingSeparator.super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003a7268;
  (this->fExponentMatcher).groupingSeparator.fUnion.fStackFields.fLengthAndFlags = 2;
  (this->fExponentMatcher).decimalSeparator.super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003a7268;
  (this->fExponentMatcher).decimalSeparator.fUnion.fStackFields.fLengthAndFlags = 2;
  (this->fExponentMatcher).fLocalDecimalUniSet.super_LocalPointerBase<const_icu_63::UnicodeSet>.ptr
       = (UnicodeSet *)0x0;
  (this->fExponentMatcher).fLocalSeparatorSet.super_LocalPointerBase<const_icu_63::UnicodeSet>.ptr =
       (UnicodeSet *)0x0;
  (this->fExponentMatcher).fLocalDigitStrings.super_LocalPointerBase<const_icu_63::UnicodeString>.
  ptr = (UnicodeString *)0x0;
  (this->fCustomMinusSign).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003a7268;
  (this->fCustomMinusSign).fUnion.fStackFields.fLengthAndFlags = 2;
  (this->fCustomPlusSign).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003a7268;
  (this->fCustomPlusSign).fUnion.fStackFields.fLengthAndFlags = 2;
  return;
}

Assistant:

ScientificMatcher() = default;